

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O2

Vec_Int_t * Llb_DriverCollectNs(Aig_Man_t *pAig,Vec_Int_t *vDriRefs)

{
  int iVar1;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar2;
  int iVar3;
  Aig_Obj_t *pObj;
  
  p = Vec_IntAlloc(pAig->nRegs);
  for (iVar3 = 0; iVar3 < pAig->nRegs; iVar3 = iVar3 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar3);
    pObj = (Aig_Obj_t *)((ulong)pAVar2->pFanin0 & 0xfffffffffffffffe);
    iVar1 = Vec_IntEntry(vDriRefs,pObj->Id);
    if ((iVar1 != 1) ||
       ((((*(uint *)&pObj->field_0x18 & 7) == 2 &&
         (iVar1 = Aig_ObjCioId(pObj), iVar1 < pAig->nTruePis)) ||
        (iVar1 = Aig_ObjIsConst1(pObj), iVar1 != 0)))) {
      pObj = pAVar2;
    }
    Vec_IntPush(p,pObj->Id);
  }
  return p;
}

Assistant:

Vec_Int_t * Llb_DriverCollectNs( Aig_Man_t * pAig, Vec_Int_t * vDriRefs )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObj, * pDri;
    int i;
    vVars = Vec_IntAlloc( Aig_ManRegNum(pAig) );
    Saig_ManForEachLi( pAig, pObj, i )
    {
        pDri = Aig_ObjFanin0(pObj);
        if ( Vec_IntEntry( vDriRefs, Aig_ObjId(pDri) ) != 1 || Saig_ObjIsPi(pAig, pDri) || Aig_ObjIsConst1(pDri) )
            Vec_IntPush( vVars, Aig_ObjId(pObj) );
        else
            Vec_IntPush( vVars, Aig_ObjId(pDri) );
    }
    return vVars;
}